

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm_xfrm.c
# Opt level: O2

void easm_cfold_sinsn(easm_sinsn *sinsn)

{
  int i;
  long lVar1;
  long lVar2;
  
  for (lVar1 = 0; lVar1 < sinsn->operandsnum; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 < sinsn->operands[lVar1]->exprsnum; lVar2 = lVar2 + 1) {
      easm_cfold_expr(sinsn->operands[lVar1]->exprs[lVar2]);
    }
  }
  return;
}

Assistant:

void easm_cfold_sinsn(struct easm_sinsn *sinsn) {
	int i, j;
	for (i = 0; i < sinsn->operandsnum; i++)
		for (j = 0; j < sinsn->operands[i]->exprsnum; j++)
			easm_cfold_expr(sinsn->operands[i]->exprs[j]);
}